

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

void __thiscall SQBlob::GrowBufOf(SQBlob *this,SQInteger n)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  SQBlob *in_RDI;
  
  if (in_RDI->_allocated < in_RDI->_size + in_RSI) {
    lVar1 = in_RDI->_size + in_RSI;
    lVar2 = in_RDI->_size * 2;
    if (lVar1 == lVar2 || SBORROW8(lVar1,lVar2) != lVar1 + in_RDI->_size * -2 < 0) {
      Resize(in_RDI,in_RSI);
    }
    else {
      Resize(in_RDI,in_RSI);
    }
  }
  in_RDI->_size = in_RDI->_size + in_RSI;
  return;
}

Assistant:

void GrowBufOf(SQInteger n)
    {
        if(_size + n > _allocated) {
            if(_size + n > _size * 2)
                Resize(_size + n);
            else
                Resize(_size * 2);
        }
        _size = _size + n;
    }